

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gltf.cpp
# Opt level: O1

bool vera::loadModel(string *_filename,Model *_model)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  string warn;
  string err;
  string ext;
  TinyGLTF loader;
  allocator local_109;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  TinyGLTF local_88;
  
  local_88.load_image_user_data_ = &local_88.fs;
  local_88.bin_data_ = (uchar *)0x0;
  local_88.bin_size_ = 0;
  local_88.is_binary_ = false;
  local_88.serialize_default_values_ = false;
  local_88.fs.FileExists = tinygltf::FileExists;
  local_88.fs.ExpandFilePath = tinygltf::ExpandFilePath;
  local_88.fs.ReadWholeFile = tinygltf::ReadWholeFile;
  local_88.fs.WriteWholeFile = tinygltf::WriteWholeFile;
  local_88.fs.user_data = (void *)0x0;
  local_88.LoadImageData = tinygltf::LoadImageData;
  local_88.WriteImageData = tinygltf::WriteImageData;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_88.write_image_user_data_ = local_88.load_image_user_data_;
  getExt(&local_a8,_filename);
  iVar3 = std::__cxx11::string::compare((char *)&local_a8);
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_a8);
    if (iVar3 != 0) {
      std::__cxx11::string::string((string *)&local_108,(_filename->_M_dataplus)._M_p,&local_109);
      bVar2 = tinygltf::TinyGLTF::LoadASCIIFromFile
                        (&local_88,_model,&local_c8,&local_e8,&local_108,1);
      goto LAB_00292c24;
    }
  }
  std::__cxx11::string::string((string *)&local_108,(_filename->_M_dataplus)._M_p,&local_109);
  bVar2 = tinygltf::TinyGLTF::LoadBinaryFromFile(&local_88,_model,&local_c8,&local_e8,&local_108,1);
LAB_00292c24:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if (local_e8._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Warn: ",6);
    _Var1._M_p = local_e8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x4678d8);
    }
    else {
      sVar4 = strlen(local_e8._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,_Var1._M_p,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  if (local_c8._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERR: ",5);
    _Var1._M_p = local_c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x4678d8);
    }
    else {
      sVar4 = strlen(local_c8._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,_Var1._M_p,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool loadModel(const std::string& _filename, tinygltf::Model& _model) {
    tinygltf::TinyGLTF loader;
    std::string err;
    std::string warn;
    std::string ext = getExt(_filename);

    bool res = false;

    // assume binary glTF.
    if (ext == "glb" || ext == "GLB")
        res = loader.LoadBinaryFromFile(&_model, &err, &warn, _filename.c_str());

    // assume ascii glTF.
    else
        res = loader.LoadASCIIFromFile(&_model, &err, &warn, _filename.c_str());

    if (!warn.empty())
        std::cout << "Warn: " << warn.c_str() << std::endl;

    if (!err.empty())
        std::cout << "ERR: " << err.c_str() << std::endl;

    return res;
}